

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool mz_zip_reader_file_stat
                  (mz_zip_archive *pZip,mz_uint file_index,mz_zip_archive_file_stat *pStat)

{
  byte bVar1;
  mz_zip_internal_state *pmVar2;
  uint uVar3;
  mz_bool mVar4;
  time_t tVar5;
  long lVar6;
  tm local_58;
  
  if ((((pZip == (mz_zip_archive *)0x0) ||
       (pmVar2 = pZip->m_pState, pmVar2 == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    lVar6 = 0;
  }
  else {
    lVar6 = (ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
            (long)(pmVar2->m_central_dir).m_p;
  }
  mVar4 = 0;
  if ((pStat != (mz_zip_archive_file_stat *)0x0) && (mVar4 = 0, lVar6 != 0)) {
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs =
         *(mz_uint32 *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + (ulong)file_index * 4);
    pStat->m_version_made_by = *(mz_uint16 *)(lVar6 + 4);
    pStat->m_version_needed = *(mz_uint16 *)(lVar6 + 6);
    pStat->m_bit_flag = *(mz_uint16 *)(lVar6 + 8);
    pStat->m_method = *(mz_uint16 *)(lVar6 + 10);
    bVar1 = *(byte *)(lVar6 + 0xc);
    local_58.tm_gmtoff = 0;
    local_58.tm_zone = (char *)0x0;
    local_58.tm_wday = 0;
    local_58.tm_yday = 0;
    local_58.tm_isdst = -1;
    local_58._36_4_ = 0;
    local_58.tm_year = (*(byte *)(lVar6 + 0xf) >> 1) + 0x50;
    local_58.tm_mon = (*(ushort *)(lVar6 + 0xe) >> 5 & 0xf) - 1;
    local_58._8_8_ =
         (ulong)CONCAT14(*(undefined1 *)(lVar6 + 0xe),(uint)(*(byte *)(lVar6 + 0xd) >> 3)) &
         0x1fffffffff;
    local_58._0_8_ =
         (ulong)CONCAT24(*(ushort *)(lVar6 + 0xc) >> 5,(uint)bVar1 + (uint)bVar1) & 0x3f0000003e;
    tVar5 = mktime(&local_58);
    pStat->m_time = tVar5;
    pStat->m_crc32 = *(mz_uint32 *)(lVar6 + 0x10);
    pStat->m_comp_size = (ulong)*(uint *)(lVar6 + 0x14);
    pStat->m_uncomp_size = (ulong)*(uint *)(lVar6 + 0x18);
    pStat->m_internal_attr = *(mz_uint16 *)(lVar6 + 0x24);
    pStat->m_external_attr = *(mz_uint32 *)(lVar6 + 0x26);
    pStat->m_local_header_ofs = (ulong)*(uint *)(lVar6 + 0x2a);
    uVar3 = 0x103;
    if (*(ushort *)(lVar6 + 0x1c) < 0x103) {
      uVar3 = (uint)*(ushort *)(lVar6 + 0x1c);
    }
    memcpy(pStat->m_filename,(void *)(lVar6 + 0x2e),(ulong)uVar3);
    pStat->m_filename[uVar3] = '\0';
    uVar3 = 0xff;
    if (*(ushort *)(lVar6 + 0x20) < 0xff) {
      uVar3 = (uint)*(ushort *)(lVar6 + 0x20);
    }
    pStat->m_comment_size = uVar3;
    memcpy(pStat->m_comment,
           (void *)((ulong)*(ushort *)(lVar6 + 0x1e) +
                   (ulong)*(ushort *)(lVar6 + 0x1c) + lVar6 + 0x2e),(ulong)uVar3);
    pStat->m_comment[uVar3] = '\0';
    mVar4 = 1;
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_reader_file_stat(mz_zip_archive *pZip, mz_uint file_index,
                                mz_zip_archive_file_stat *pStat) {
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if ((!p) || (!pStat))
    return MZ_FALSE;

  // Unpack the central directory record.
  pStat->m_file_index = file_index;
  pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(
      &pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
  pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
  pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
  pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
  pStat->m_time =
      mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                           MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
  pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
  pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
  pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
  pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

  // Copy as much of the filename and comment as possible.
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
  memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
  pStat->m_filename[n] = '\0';

  n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
  pStat->m_comment_size = n;
  memcpy(pStat->m_comment, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
         n);
  pStat->m_comment[n] = '\0';

  return MZ_TRUE;
}